

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_change.c
# Opt level: O0

int speed_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  void *pvVar1;
  SRC_STATE *pSVar2;
  undefined4 in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  SRC_STATE *new;
  int error;
  speed_segment_data *data;
  mixed_segment *segment_local;
  void *value_local;
  uint32_t field_local;
  
  pvVar1 = segment->data;
  if (field == 1) {
    if ((*value & 1) == 0) {
      segment->mix = speed_segment_mix;
    }
    else {
      segment->mix = speed_segment_mix_bypass;
    }
  }
  else {
    if (field == 4) {
      pSVar2 = src_new((int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                       (int)in_stack_ffffffffffffffc8,(int *)CONCAT44(4,in_stack_ffffffffffffffc0));
      if (pSVar2 == (SRC_STATE *)0x0) {
        mixed_err(0xf);
        return 0;
      }
      if (*(long *)((long)pvVar1 + 0x10) != 0) {
        src_delete((SRC_STATE *)CONCAT44(field,in_stack_ffffffffffffffc0));
      }
      *(SRC_STATE **)((long)pvVar1 + 0x10) = pSVar2;
      return 1;
    }
    if (field != 0x27) {
      mixed_err(7);
      return 0;
    }
    if (*value <= 0.0) {
      mixed_err(8);
      return 0;
    }
    *(undefined8 *)((long)pvVar1 + 0x18) = *value;
  }
  return 1;
}

Assistant:

int speed_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct speed_segment_data *data = (struct speed_segment_data *)segment->data;
  switch(field){
  case MIXED_RESAMPLE_TYPE: {
    int error;
    SRC_STATE *new = src_new(*(enum mixed_resample_type *)value, 1, &error);
    if(!new) {
      mixed_err(MIXED_RESAMPLE_FAILED);
      return 0;
    }
    if(data->resample_state)
      src_delete(data->resample_state);
    data->resample_state = new;
  }
    return 1;
  case MIXED_SPEED_FACTOR:
    if(*(double *)value <= 0.0){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->speed = *(double *)value;
    break;
  case MIXED_BYPASS:
    if(*(bool *)value){
      segment->mix = speed_segment_mix_bypass;
    }else{
      segment->mix = speed_segment_mix;
    }
    break;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
  return 1;
}